

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# straight-recognizer.cpp
# Opt level: O1

set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> * __thiscall
mahjong::StraightRecognizer::recognize
          (set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
           *__return_storage_ptr__,StraightRecognizer *this)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  ulong uVar3;
  bool bVar4;
  initializer_list<mahjong::Pattern> __l;
  initializer_list<mahjong::Pattern> __l_00;
  allocator_type local_24;
  less<mahjong::Pattern> local_23;
  allocator_type local_22;
  less<mahjong::Pattern> local_21;
  Pattern local_20 [2];
  
  lVar2 = 0;
  bVar4 = false;
  do {
    if ((((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[lVar2] == true) &&
        ((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[lVar2 + 1] == true)) &&
       ((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[lVar2 + 2] == true)) {
      local_20[1] = 0x17;
      __l._M_len = 1;
      __l._M_array = local_20 + 1;
      std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
      set(__return_storage_ptr__,__l,&local_21,&local_22);
      if (!bVar4) {
        return __return_storage_ptr__;
      }
      break;
    }
    lVar2 = lVar2 + 3;
    bVar4 = lVar2 == 0x1b;
  } while (!bVar4);
  uVar3 = 0;
  bVar4 = false;
  while ((((this->has_front_tile_of_sequences)._M_elems[0]._M_elems[uVar3] != true ||
          ((this->has_front_tile_of_sequences)._M_elems[3]._M_elems[uVar3] != true)) ||
         ((this->has_front_tile_of_sequences)._M_elems[6]._M_elems[uVar3] != true))) {
    bVar4 = 1 < uVar3;
    uVar3 = uVar3 + 1;
    if (uVar3 == 3) {
LAB_0019a604:
      p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header = 0;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
      return __return_storage_ptr__;
    }
  }
  local_20[0] = Straight;
  __l_00._M_len = 1;
  __l_00._M_array = local_20;
  std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::set
            (__return_storage_ptr__,__l_00,&local_23,&local_24);
  if (!bVar4) {
    return __return_storage_ptr__;
  }
  goto LAB_0019a604;
}

Assistant:

std::set<Pattern> StraightRecognizer::recognize()
{
	for (const auto& it : has_front_tile_of_sequences)
	{
		if (it[0] && it[1] && it[2])
		{
			return { Pattern::ThreeColourStraights };
		}
	}

	for (auto i = 0; i < 3; i++)
	{
		// check tiles 1, 4 and 7 each suit
		// 123 456 789 xxx
		if (has_front_tile_of_sequences[0][i] &&
			has_front_tile_of_sequences[3][i] &&
			has_front_tile_of_sequences[6][i])
		{
			return { Pattern::Straight };
		}
	}

	return {};
}